

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.c
# Opt level: O0

int main(int argc,char **argv)

{
  byte bVar1;
  int iVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  FILE *__stream;
  size_t sVar5;
  wasm_memory_t *pwVar6;
  wasm_func_t *func;
  wasm_func_t *func_00;
  wasm_func_t *func_01;
  ulong uVar7;
  long lVar8;
  char *pcVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  wasm_memory_t *memory2;
  wasm_memorytype_t *memorytype;
  wasm_limits_t limits;
  wasm_memory_t *copy;
  wasm_func_t *store_func;
  wasm_func_t *load_func;
  wasm_func_t *size_func;
  wasm_memory_t *memory;
  size_t i;
  wasm_extern_vec_t exports;
  wasm_instance_t *instance;
  wasm_extern_vec_t imports;
  wasm_module_t *module;
  wasm_byte_vec_t binary;
  size_t file_size;
  FILE *file;
  wasm_store_t *store;
  wasm_engine_t *engine;
  char **argv_local;
  int argc_local;
  
  printf("Initializing...\n");
  uVar3 = wasm_engine_new();
  uVar4 = wasm_store_new(uVar3);
  printf("Loading binary...\n");
  __stream = fopen("memory.wasm","rb");
  if (__stream == (FILE *)0x0) {
    printf("> Error loading module!\n");
    argv_local._4_4_ = 1;
  }
  else {
    fseek(__stream,0,2);
    binary.data = (wasm_byte_t *)ftell(__stream);
    fseek(__stream,0,0);
    wasm_byte_vec_new_uninitialized(&module,binary.data);
    sVar5 = fread((void *)binary.size,(size_t)binary.data,1,__stream);
    if (sVar5 == 1) {
      fclose(__stream);
      printf("Compiling module...\n");
      imports.data = (wasm_extern_t **)wasm_module_new(uVar4);
      if (imports.data == (wasm_extern_t **)0x0) {
        printf("> Error compiling module!\n");
        argv_local._4_4_ = 1;
      }
      else {
        wasm_byte_vec_delete(&module);
        printf("Instantiating module...\n");
        memset(&instance,0,0x10);
        exports.data = (wasm_extern_t **)wasm_instance_new(uVar4,imports.data,&instance,0);
        if (exports.data == (wasm_extern_t **)0x0) {
          printf("> Error instantiating module!\n");
          argv_local._4_4_ = 1;
        }
        else {
          printf("Extracting exports...\n");
          wasm_instance_exports(exports.data,&i);
          pwVar6 = get_export_memory((wasm_extern_vec_t *)&i,0);
          func = get_export_func((wasm_extern_vec_t *)&i,1);
          func_00 = get_export_func((wasm_extern_vec_t *)&i,2);
          func_01 = get_export_func((wasm_extern_vec_t *)&i,3);
          wasm_module_delete(imports.data);
          limits = (wasm_limits_t)wasm_memory_copy(pwVar6);
          uVar7 = wasm_memory_same(pwVar6,limits);
          if ((uVar7 & 1) == 0) {
            __assert_fail("wasm_memory_same(memory, copy)",
                          "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/third_party/wasm-c-api/example/memory.c"
                          ,0x9a,"int main(int, const char **)");
          }
          wasm_memory_delete(limits);
          printf("Checking memory...\n");
          iVar2 = wasm_memory_size(pwVar6);
          check(iVar2 == 2);
          lVar8 = wasm_memory_data_size(pwVar6);
          check(lVar8 == 0x20000);
          pcVar9 = (char *)wasm_memory_data(pwVar6);
          check(*pcVar9 == '\0');
          lVar8 = wasm_memory_data(pwVar6);
          check(*(char *)(lVar8 + 0x1000) == '\x01');
          lVar8 = wasm_memory_data(pwVar6);
          check(*(char *)(lVar8 + 0x1003) == '\x04');
          check_call0(func,2);
          check_call1(func_00,0,0);
          check_call1(func_00,0x1000,1);
          check_call1(func_00,0x1003,4);
          check_call1(func_00,0x1ffff,0);
          check_trap1(func_00,0x20000);
          printf("Mutating memory...\n");
          lVar8 = wasm_memory_data(pwVar6);
          *(undefined1 *)(lVar8 + 0x1003) = 5;
          check_ok2(func_01,0x1002,6);
          check_trap2(func_01,0x20000,0);
          lVar8 = wasm_memory_data(pwVar6);
          check(*(char *)(lVar8 + 0x1002) == '\x06');
          lVar8 = wasm_memory_data(pwVar6);
          check(*(char *)(lVar8 + 0x1003) == '\x05');
          check_call1(func_00,0x1002,6);
          check_call1(func_00,0x1003,5);
          printf("Growing memory...\n");
          bVar1 = wasm_memory_grow(pwVar6,1);
          check((_Bool)(bVar1 & 1));
          iVar2 = wasm_memory_size(pwVar6);
          check(iVar2 == 3);
          lVar8 = wasm_memory_data_size(pwVar6);
          check(lVar8 == 0x30000);
          check_call1(func_00,0x20000,0);
          check_ok2(func_01,0x20000,0);
          check_trap1(func_00,0x30000);
          check_trap2(func_01,0x30000,0);
          bVar1 = wasm_memory_grow(pwVar6,1);
          check((_Bool)((bVar1 ^ 0xff) & 1));
          bVar1 = wasm_memory_grow(pwVar6,0);
          check((_Bool)(bVar1 & 1));
          wasm_extern_vec_delete(&i);
          wasm_instance_delete(exports.data);
          printf("Creating stand-alone memory...\n");
          memorytype = (wasm_memorytype_t *)0x500000005;
          uVar10 = wasm_memorytype_new(&memorytype);
          uVar11 = wasm_memory_new(uVar4,uVar10);
          iVar2 = wasm_memory_size(uVar11);
          check(iVar2 == 5);
          bVar1 = wasm_memory_grow(uVar11,1);
          check((_Bool)((bVar1 ^ 0xff) & 1));
          bVar1 = wasm_memory_grow(uVar11,0);
          check((_Bool)(bVar1 & 1));
          wasm_memorytype_delete(uVar10);
          wasm_memory_delete(uVar11);
          printf("Shutting down...\n");
          wasm_store_delete(uVar4);
          wasm_engine_delete(uVar3);
          printf("Done.\n");
          argv_local._4_4_ = 0;
        }
      }
    }
    else {
      printf("> Error loading module!\n");
      argv_local._4_4_ = 1;
    }
  }
  return argv_local._4_4_;
}

Assistant:

int main(int argc, const char* argv[]) {
  // Initialize.
  printf("Initializing...\n");
  wasm_engine_t* engine = wasm_engine_new();
  wasm_store_t* store = wasm_store_new(engine);

  // Load binary.
  printf("Loading binary...\n");
  FILE* file = fopen("memory.wasm", "rb");
  if (!file) {
    printf("> Error loading module!\n");
    return 1;
  }
  fseek(file, 0L, SEEK_END);
  size_t file_size = ftell(file);
  fseek(file, 0L, SEEK_SET);
  wasm_byte_vec_t binary;
  wasm_byte_vec_new_uninitialized(&binary, file_size);
  if (fread(binary.data, file_size, 1, file) != 1) {
    printf("> Error loading module!\n");
    return 1;
  }
  fclose(file);

  // Compile.
  printf("Compiling module...\n");
  own wasm_module_t* module = wasm_module_new(store, &binary);
  if (!module) {
    printf("> Error compiling module!\n");
    return 1;
  }

  wasm_byte_vec_delete(&binary);

  // Instantiate.
  printf("Instantiating module...\n");
  wasm_extern_vec_t imports = WASM_EMPTY_VEC;
  own wasm_instance_t* instance =
    wasm_instance_new(store, module, &imports, NULL);
  if (!instance) {
    printf("> Error instantiating module!\n");
    return 1;
  }

  // Extract export.
  printf("Extracting exports...\n");
  own wasm_extern_vec_t exports;
  wasm_instance_exports(instance, &exports);
  size_t i = 0;
  wasm_memory_t* memory = get_export_memory(&exports, i++);
  wasm_func_t* size_func = get_export_func(&exports, i++);
  wasm_func_t* load_func = get_export_func(&exports, i++);
  wasm_func_t* store_func = get_export_func(&exports, i++);

  wasm_module_delete(module);

  // Try cloning.
  own wasm_memory_t* copy = wasm_memory_copy(memory);
  assert(wasm_memory_same(memory, copy));
  wasm_memory_delete(copy);

  // Check initial memory.
  printf("Checking memory...\n");
  check(wasm_memory_size(memory) == 2);
  check(wasm_memory_data_size(memory) == 0x20000);
  check(wasm_memory_data(memory)[0] == 0);
  check(wasm_memory_data(memory)[0x1000] == 1);
  check(wasm_memory_data(memory)[0x1003] == 4);

  check_call0(size_func, 2);
  check_call1(load_func, 0, 0);
  check_call1(load_func, 0x1000, 1);
  check_call1(load_func, 0x1003, 4);
  check_call1(load_func, 0x1ffff, 0);
  check_trap1(load_func, 0x20000);

  // Mutate memory.
  printf("Mutating memory...\n");
  wasm_memory_data(memory)[0x1003] = 5;
  check_ok2(store_func, 0x1002, 6);
  check_trap2(store_func, 0x20000, 0);

  check(wasm_memory_data(memory)[0x1002] == 6);
  check(wasm_memory_data(memory)[0x1003] == 5);
  check_call1(load_func, 0x1002, 6);
  check_call1(load_func, 0x1003, 5);

  // Grow memory.
  printf("Growing memory...\n");
  check(wasm_memory_grow(memory, 1));
  check(wasm_memory_size(memory) == 3);
  check(wasm_memory_data_size(memory) == 0x30000);

  check_call1(load_func, 0x20000, 0);
  check_ok2(store_func, 0x20000, 0);
  check_trap1(load_func, 0x30000);
  check_trap2(store_func, 0x30000, 0);

  check(! wasm_memory_grow(memory, 1));
  check(wasm_memory_grow(memory, 0));

  wasm_extern_vec_delete(&exports);
  wasm_instance_delete(instance);

  // Create stand-alone memory.
  // TODO(wasm+): Once Wasm allows multiple memories, turn this into import.
  printf("Creating stand-alone memory...\n");
  wasm_limits_t limits = {5, 5};
  own wasm_memorytype_t* memorytype = wasm_memorytype_new(&limits);
  own wasm_memory_t* memory2 = wasm_memory_new(store, memorytype);
  check(wasm_memory_size(memory2) == 5);
  check(! wasm_memory_grow(memory2, 1));
  check(wasm_memory_grow(memory2, 0));

  wasm_memorytype_delete(memorytype);
  wasm_memory_delete(memory2);

  // Shut down.
  printf("Shutting down...\n");
  wasm_store_delete(store);
  wasm_engine_delete(engine);

  // All done.
  printf("Done.\n");
  return 0;
}